

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<QLayoutStruct>::QList(QList<QLayoutStruct> *this,qsizetype size)

{
  long in_RSI;
  QArrayDataPointer<QLayoutStruct> *in_RDI;
  QArrayDataPointer<QLayoutStruct> *unaff_retaddr;
  QArrayDataPointer<QLayoutStruct> *newSize;
  
  newSize = in_RDI;
  QArrayDataPointer<QLayoutStruct>::QArrayDataPointer
            (&this->d,size,(qsizetype)unaff_retaddr,(AllocationOption)((ulong)in_RDI >> 0x20));
  if (in_RSI != 0) {
    QArrayDataPointer<QLayoutStruct>::operator->(in_RDI);
    QArrayDataPointer<QLayoutStruct>::appendInitialize(unaff_retaddr,(qsizetype)newSize);
  }
  return;
}

Assistant:

explicit QList(qsizetype size)
        : d(size)
    {
        if (size)
            d->appendInitialize(size);
    }